

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall mario::EPoller::updateChannel(EPoller *this,Channel *channel)

{
  byte bVar1;
  Writer *pWVar2;
  mapped_type *ppCVar3;
  int iVar4;
  int fd;
  Writer local_90;
  
  EventLoop::assertInLoopThread(this->_loop);
  local_90._vptr_Writer = (_func_int **)&PTR__Writer_0012be10;
  local_90.m_msg = (LogMessage *)0x0;
  local_90.m_level = Info;
  local_90.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
  ;
  local_90.m_line = 0x3d;
  local_90.m_func = "void mario::EPoller::updateChannel(Channel *)";
  local_90.m_verboseLevel = 0;
  local_90.m_logger = (Logger *)0x0;
  local_90.m_proceed = false;
  local_90.m_messageBuilder.m_logger = (Logger *)0x0;
  local_90.m_messageBuilder.m_containerLogSeperator = "";
  local_90.m_dispatchAction = NormalLog;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar2 = el::base::Writer::construct(&local_90,1,"default");
  bVar1 = pWVar2->m_proceed;
  if ((bool)bVar1 == true) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"fd= ");
    bVar1 = pWVar2->m_proceed;
  }
  if ((bVar1 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,channel->_fd);
    bVar1 = pWVar2->m_proceed;
  }
  if ((bVar1 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,", events = ");
    bVar1 = pWVar2->m_proceed;
  }
  if ((bVar1 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,channel->_events);
  }
  el::base::Writer::~Writer(&local_90);
  iVar4 = channel->_index;
  if ((iVar4 == 2) || (iVar4 == -1)) {
    local_90._vptr_Writer = (_func_int **)CONCAT44(local_90._vptr_Writer._4_4_,channel->_fd);
    if (iVar4 == -1) {
      ppCVar3 = std::
                map<int,_mario::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
                ::operator[](&this->_channels,(key_type *)&local_90);
      *ppCVar3 = channel;
    }
    channel->_index = 1;
    iVar4 = 1;
  }
  else {
    if (channel->_events == 0) {
      update(this,2,channel);
      channel->_index = 2;
      return;
    }
    iVar4 = 3;
  }
  update(this,iVar4,channel);
  return;
}

Assistant:

void EPoller::updateChannel(Channel* channel) {
    assertInLoopThread();
    LOG(INFO) << "fd= "<< channel->fd() << ", events = " << channel->events();
    const int index = channel->index();
    if (index == kNew || index == kDeleted) {
        int fd = channel->fd();
        if (index == kNew) {
            _channels[fd] = channel;
        }
        channel->setIndex(kAdded);
        update(EPOLL_CTL_ADD, channel);
    } else {
        int fd = channel->fd();
        if (channel->isNoneEvent()) {
            update(EPOLL_CTL_DEL, channel);
            channel->setIndex(kDeleted);
        } else {
            update(EPOLL_CTL_MOD, channel);
        }
    }
}